

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>
          (Assert *this,int t,vector<int,_std::allocator<int>_> *container)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  NotIn<int,std::vector<int,std::allocator<int>>&>(this,&local_28,t,container);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void NotIn(T t, Container&& container) const
        {
            NotIn(std::string(), t, std::forward<Container>(container));
        }